

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argh.h
# Opt level: O2

bool __thiscall argh::parser::got_flag(parser *this,string *name)

{
  const_iterator cVar1;
  string sStack_38;
  
  trim_leading_dashes(&sStack_38,this,name);
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&(this->flags_)._M_t,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return &(this->flags_)._M_t._M_impl.super__Rb_tree_header != (_Rb_tree_header *)cVar1._M_node;
}

Assistant:

inline bool argh::parser::got_flag(std::string const& name) const
   {
      return flags_.end() != flags_.find(trim_leading_dashes(name));
   }